

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context_regular_mode.h
# Opt level: O0

int32_t __thiscall
charls::context_regular_mode::get_golomb_coding_parameter(context_regular_mode *this)

{
  int local_14;
  int32_t k;
  context_regular_mode *this_local;
  
  for (local_14 = 0; this->n_ << ((byte)local_14 & 0x1f) < this->a_ && local_14 < 0x10;
      local_14 = local_14 + 1) {
  }
  if (local_14 != 0x10) {
    return local_14;
  }
  impl::throw_jpegls_error(InvalidCompressedData);
}

Assistant:

FORCE_INLINE int32_t get_golomb_coding_parameter() const
    {
        int32_t k{};
        for (; n_ << k < a_ && k < max_k_value; ++k)
        {
        }

        if (UNLIKELY(k == max_k_value))
            impl::throw_jpegls_error(jpegls_errc::invalid_encoded_data);

        return k;
    }